

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

nng_err nni_http_server_add_handler(nni_http_server *s,nni_http_handler *h)

{
  int iVar1;
  void *pvVar2;
  nng_err nVar3;
  nni_list *list;
  
  nVar3 = NNG_EINVAL;
  if (((h->uri[0] == '/') || (h->uri[0] == '\0')) && (h->cb != (nng_http_handler_func)0x0)) {
    nni_mtx_lock(&s->mtx);
    list = &s->handlers;
    pvVar2 = nni_list_first(list);
    if (pvVar2 != (void *)0x0) {
      do {
        iVar1 = nni_strcasecmp((char *)((long)pvVar2 + 0x430),h->host);
        if (((iVar1 == 0) && (iVar1 = strcmp((char *)((long)pvVar2 + 0x410),h->method), iVar1 == 0))
           && (iVar1 = strcmp(h->uri,(char *)((long)pvVar2 + 0x10)), iVar1 == 0)) {
          nVar3 = NNG_EADDRINUSE;
          goto LAB_00135456;
        }
        pvVar2 = nni_list_next(list,pvVar2);
      } while (pvVar2 != (void *)0x0);
    }
    for (pvVar2 = nni_list_first(list); pvVar2 != (void *)0x0; pvVar2 = nni_list_next(list,pvVar2))
    {
      iVar1 = strcmp(h->uri,(char *)((long)pvVar2 + 0x10));
      if (0 < iVar1) {
        nni_list_insert_before(list,h,pvVar2);
        goto LAB_00135440;
      }
    }
    nni_list_append(list,h);
LAB_00135440:
    nni_atomic_set_bool(&h->busy,true);
    nVar3 = NNG_OK;
LAB_00135456:
    nni_mtx_unlock(&s->mtx);
  }
  return nVar3;
}

Assistant:

nng_err
nni_http_server_add_handler(nni_http_server *s, nni_http_handler *h)
{
	nni_http_handler *h2;

	// Must have a legal method (and not one that is HEAD), path,
	// and handler.  (The reason HEAD is verboten is that we supply
	// it automatically as part of GET support.)
	if (((h->uri[0] != 0) && (h->uri[0] != '/')) || (h->cb == NULL)) {
		return (NNG_EINVAL);
	}

	nni_mtx_lock(&s->mtx);
	// General rule for finding a conflict is that if either uri
	// string is an exact duplicate of the other, then we have a
	// collision.  (But only if the methods match, and the host
	// matches.)  Note that a wild card host matches both.
	NNI_LIST_FOREACH (&s->handlers, h2) {

		if (nni_strcasecmp(h2->host, h->host) != 0) {
			// Hosts don't match, so we are safe.
			continue;
		}
		if (strcmp(h2->method, h->method) != 0) {
			// Different methods, so again we are fine.
			continue;
		}

		if (strcmp(h->uri, h2->uri) != 0) {
			continue; // not a duplicate
		}

		nni_mtx_unlock(&s->mtx);
		return (NNG_EADDRINUSE);
	}

	// Maintain list of handlers in longest uri first order
	NNI_LIST_FOREACH (&s->handlers, h2) {
		if (strcmp(h->uri, h2->uri) > 0) {
			nni_list_insert_before(&s->handlers, h, h2);
			break;
		}
	}
	if (h2 == NULL) {
		nni_list_append(&s->handlers, h);
	}

	// Note that we have borrowed the reference count on the handler.
	// Thus we own it, and if the server is destroyed while we have it,
	// then we must finalize it it too.  We do mark it busy so
	// that other settings cannot change.
	nni_atomic_set_bool(&h->busy, true);

	nni_mtx_unlock(&s->mtx);
	return (NNG_OK);
}